

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForField
          (Generator *this,FieldDescriptor *field)

{
  undefined8 uVar1;
  bool bVar2;
  FieldOptions *this_00;
  string *psVar3;
  Descriptor *pDVar4;
  allocator local_111;
  string local_110;
  string local_f0;
  allocator local_c9;
  string local_c8;
  string local_a8;
  undefined1 local_88 [8];
  string field_name;
  string local_58;
  undefined1 local_38 [8];
  string field_options;
  FieldDescriptor *field_local;
  Generator *this_local;
  
  field_options.field_2._8_8_ = field;
  this_00 = FieldDescriptor::options(field);
  MessageLite::SerializeAsString_abi_cxx11_(&local_58,(MessageLite *)this_00);
  OptionsValue((string *)local_38,this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"None");
  if (bVar2) {
    std::__cxx11::string::string((string *)local_88);
    bVar2 = FieldDescriptor::is_extension((FieldDescriptor *)field_options.field_2._8_8_);
    if (bVar2) {
      pDVar4 = FieldDescriptor::extension_scope((FieldDescriptor *)field_options.field_2._8_8_);
      if (pDVar4 == (Descriptor *)0x0) {
        psVar3 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)field_options.field_2._8_8_);
        std::__cxx11::string::operator=((string *)local_88,(string *)psVar3);
      }
      else {
        pDVar4 = FieldDescriptor::extension_scope((FieldDescriptor *)field_options.field_2._8_8_);
        uVar1 = field_options.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c8,"extensions_by_name",&local_c9);
        FieldReferencingExpression(&local_a8,this,pDVar4,(FieldDescriptor *)uVar1,&local_c8);
        std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      }
    }
    else {
      pDVar4 = FieldDescriptor::containing_type((FieldDescriptor *)field_options.field_2._8_8_);
      uVar1 = field_options.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,"fields_by_name",&local_111);
      FieldReferencingExpression(&local_f0,this,pDVar4,(FieldDescriptor *)uVar1,&local_110);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
    anon_unknown_0::PrintDescriptorOptionsFixingCode
              ((string *)local_88,(string *)local_38,this->printer_);
    std::__cxx11::string::~string((string *)local_88);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Generator::FixOptionsForField(const FieldDescriptor& field) const {
  std::string field_options = OptionsValue(field.options().SerializeAsString());
  if (field_options != "None") {
    std::string field_name;
    if (field.is_extension()) {
      if (field.extension_scope() == nullptr) {
        // Top level extensions.
        field_name = field.name();
      } else {
        field_name = FieldReferencingExpression(field.extension_scope(), field,
                                                "extensions_by_name");
      }
    } else {
      field_name = FieldReferencingExpression(field.containing_type(), field,
                                              "fields_by_name");
    }
    PrintDescriptorOptionsFixingCode(field_name, field_options, printer_);
  }
}